

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O0

Config * __thiscall QPDFJob::Config::streamData(Config *this,string *parameter)

{
  bool bVar1;
  element_type *peVar2;
  allocator<char> local_39;
  string local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *parameter_local;
  Config *this_local;
  
  local_18 = parameter;
  parameter_local = (string *)this;
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this->o);
  peVar2->stream_data_set = true;
  bVar1 = std::operator==(local_18,"compress");
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this->o);
    peVar2->stream_data_mode = qpdf_s_compress;
  }
  else {
    bVar1 = std::operator==(local_18,"preserve");
    if (bVar1) {
      peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this->o);
      peVar2->stream_data_mode = qpdf_s_preserve;
    }
    else {
      bVar1 = std::operator==(local_18,"uncompress");
      if (bVar1) {
        peVar2 = std::
                 __shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this->o);
        peVar2->stream_data_mode = qpdf_s_uncompress;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_38,"invalid stream-data option",&local_39);
        usage(&local_38);
        std::__cxx11::string::~string((string *)&local_38);
        std::allocator<char>::~allocator(&local_39);
      }
    }
  }
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::streamData(std::string const& parameter)
{
    o.m->stream_data_set = true;
    if (parameter == "compress") {
        o.m->stream_data_mode = qpdf_s_compress;
    } else if (parameter == "preserve") {
        o.m->stream_data_mode = qpdf_s_preserve;
    } else if (parameter == "uncompress") {
        o.m->stream_data_mode = qpdf_s_uncompress;
    } else {
        usage("invalid stream-data option");
    }
    return this;
}